

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9TokenizeInput(SyStream *pStream,SyToken *pToken,void *pUserData,void *pCtxData)

{
  uint uVar1;
  uchar *puVar2;
  void *pvVar3;
  SySet *pSVar4;
  ushort *puVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  sxu32 sVar10;
  sxi32 sVar11;
  ushort **ppuVar12;
  jx9_expr_op *pjVar13;
  ulong uVar14;
  byte *pbVar15;
  byte *pbVar16;
  ulong uVar17;
  long lVar18;
  byte *pbVar19;
  uint uVar20;
  uchar *puVar21;
  byte bVar22;
  SyToken *pLast;
  char *zSrc;
  byte *pbVar23;
  int iVar24;
  byte *pbVar25;
  byte *pbVar26;
  sxu32 local_78;
  uint local_58;
  byte *local_50;
  uint uVar9;
  
  puVar2 = pStream->zText;
  pbVar26 = pStream->zEnd;
  puVar21 = puVar2 + -1;
  uVar9 = (uint)puVar2;
  iVar8 = -uVar9;
  lVar18 = 0;
  while( true ) {
    pbVar16 = puVar2 + lVar18;
    if (pbVar26 <= pbVar16) {
      return -0x12;
    }
    bVar22 = *pbVar16;
    if ((0xbf < (ulong)bVar22) ||
       (ppuVar12 = __ctype_b_loc(), (*(byte *)((long)*ppuVar12 + (ulong)bVar22 * 2 + 1) & 0x20) == 0
       )) break;
    if (bVar22 == 10) {
      pStream->nLine = pStream->nLine + 1;
    }
    pStream->zText = puVar2 + lVar18 + 1;
    lVar18 = lVar18 + 1;
    puVar21 = puVar21 + 1;
    iVar8 = iVar8 + 0x7fffffff;
  }
  local_78 = pStream->nLine;
  pToken->nLine = local_78;
  pToken->pUserData = (void *)0x0;
  (pToken->sData).zString = (char *)pbVar16;
  (pToken->sData).nByte = 0;
  bVar22 = puVar2[lVar18];
  uVar14 = (ulong)bVar22;
  iVar24 = (int)lVar18;
  pbVar19 = pbVar16;
  if (0xbf < uVar14) goto LAB_00121c49;
  ppuVar12 = __ctype_b_loc();
  if ((uVar14 == 0x5f) || (((*ppuVar12)[uVar14] & 0x400) != 0)) {
    pbVar25 = puVar2 + lVar18 + 1;
    do {
      pStream->zText = pbVar25;
      pbVar19 = pbVar25;
LAB_00121c49:
      pbVar25 = pbVar19;
      if (0xbf < *pbVar19) {
        pbVar25 = pbVar19 + 1;
      }
      while (((pbVar25 < pbVar26 && (uVar14 = (ulong)*pbVar25, uVar14 < 0xc0)) &&
             ((ppuVar12 = __ctype_b_loc(), uVar14 == 0x5f || (((*ppuVar12)[uVar14] & 8) != 0))))) {
        pbVar25 = pbVar25 + 1;
      }
    } while (pbVar25 != pbVar19);
    iVar6 = (int)pbVar19;
    uVar20 = (iVar6 - uVar9) - iVar24;
    (pToken->sData).nByte = uVar20;
    if (1 < (int)uVar20) {
      pbVar26 = keywordCode_aHash +
                (int)((int)(char)*pbVar16 << 2 ^ uVar20 ^
                     (char)puVar21[iVar8 + iVar6 & 0x7fffffff] * 3) % 0x3b;
      while (*pbVar26 != 0) {
        uVar14 = (ulong)(*pbVar26 - 1);
        if (((iVar6 - (uint)(byte)keywordCode_aLen[uVar14]) - uVar9 == iVar24) &&
           (sVar11 = SyMemcmp("printegereturnconstaticaselseifloatincludefaultDIEXITcontinuediewhileASPRINTbooleanbreakforeachfunctionimportstringswitchuplink"
                              + *(ushort *)(keywordCode_aOffset + uVar14 * 2),pbVar16,uVar20),
           sVar11 == 0)) {
          uVar9 = *(uint *)(keywordCode_aCode + uVar14 * 4);
          pToken->nType = 4;
          pToken->pUserData = (void *)(ulong)uVar9;
          return 0;
        }
        pbVar26 = keywordCode_aNext + uVar14;
      }
    }
    pToken->nType = 8;
    return 0;
  }
  if (uVar14 == 0x23) {
LAB_001210a8:
    pbVar16 = puVar2 + lVar18;
    do {
      pbVar16 = pbVar16 + 1;
      pStream->zText = pbVar16;
      if (pbVar26 <= pbVar16) {
        return -0x19;
      }
    } while (*pbVar16 != 10);
    return -0x19;
  }
  if ((bVar22 == 0x2f) && (pbVar16 = puVar2 + lVar18 + 1, pbVar16 < pbVar26)) {
    if (*pbVar16 == 0x2f) goto LAB_001210a8;
    if (*pbVar16 == 0x2a) {
      for (pbVar16 = puVar2 + lVar18 + 2; pStream->zText = pbVar16, pbVar16 < pbVar26;
          pbVar16 = pbVar16 + 1) {
        if (*pbVar16 == 10) {
          local_78 = local_78 + 1;
          pStream->nLine = local_78;
        }
        else if ((*pbVar16 == 0x2a) && ((pbVar26 <= pbVar16 + 1 || (pbVar16[1] == 0x2f)))) break;
      }
      pStream->zText = pbVar16 + 2;
      return -0x19;
    }
  }
  if (((*ppuVar12)[uVar14] >> 0xb & 1) != 0) {
    pbVar16 = puVar2 + lVar18 + 2;
    do {
      pbVar25 = pbVar16;
      pbVar19 = pbVar25 + -1;
      pStream->zText = pbVar19;
      if (pbVar26 <= pbVar19) {
        pToken->nType = 1;
        goto LAB_00121bf7;
      }
    } while (((ulong)*pbVar19 < 0xc0) &&
            (pbVar16 = pbVar25 + 1, (*(byte *)((long)*ppuVar12 + (ulong)*pbVar19 * 2 + 1) & 8) != 0)
            );
    pToken->nType = 1;
    if (pbVar25[-1] == 0x2e) {
      pbVar16 = pbVar25 + 2;
      do {
        pbVar25 = pbVar16;
        pbVar19 = pbVar25 + -2;
        pStream->zText = pbVar19;
        if (pbVar26 <= pbVar19) goto LAB_00121bef;
        bVar22 = *pbVar19;
      } while (((ulong)bVar22 < 0xc0) &&
              (pbVar16 = pbVar25 + 1, (*(byte *)((long)*ppuVar12 + (ulong)bVar22 * 2 + 1) & 8) != 0)
              );
      if ((bVar22 & 0xdf) == 0x45) {
        pbVar19 = pbVar25 + -1;
        pStream->zText = pbVar19;
        if (pbVar19 < pbVar26) {
          if ((*pbVar19 != 0x2b) && (*pbVar19 != 0x2d)) goto LAB_00121bcb;
          if (pbVar26 <= pbVar25) goto LAB_00121bcb;
          if (0xbf < (ulong)*pbVar25) goto LAB_00121bcb;
          if ((*(byte *)((long)*ppuVar12 + (ulong)*pbVar25 * 2 + 1) & 8) == 0) goto LAB_00121bcb;
          while( true ) {
            pStream->zText = pbVar25;
            pbVar19 = pbVar25;
LAB_00121bcb:
            if (((pbVar26 <= pbVar19) || (0xbf < (ulong)*pbVar19)) ||
               ((*(byte *)((long)*ppuVar12 + (ulong)*pbVar19 * 2 + 1) & 8) == 0)) break;
            pbVar25 = pbVar19 + 1;
          }
        }
      }
LAB_00121bef:
      pToken->nType = 2;
    }
    else {
      bVar22 = pbVar25[-1] & 0xdf;
      if (bVar22 == 0x42) {
        do {
          pbVar19 = pbVar25;
          pStream->zText = pbVar19;
          if (pbVar26 <= pbVar19) break;
          pbVar25 = pbVar19 + 1;
        } while ((*pbVar19 & 0xfe) == 0x30);
      }
      else if (bVar22 == 0x45) {
        pStream->zText = pbVar25;
        if (pbVar25 < pbVar26) {
          if ((*pbVar25 != 0x2b) && (*pbVar25 != 0x2d)) goto LAB_00121c0d;
          pbVar16 = pbVar25 + 1;
          if (pbVar26 <= pbVar16) goto LAB_00121c0d;
          if (0xbf < (ulong)*pbVar16) goto LAB_00121c0d;
          if ((*(byte *)((long)*ppuVar12 + (ulong)*pbVar16 * 2 + 1) & 8) == 0) goto LAB_00121c0d;
          while( true ) {
            pbVar25 = pbVar16;
            pStream->zText = pbVar25;
LAB_00121c0d:
            if (((pbVar26 <= pbVar25) || (0xbf < (ulong)*pbVar25)) ||
               ((*(byte *)((long)*ppuVar12 + (ulong)*pbVar25 * 2 + 1) & 8) == 0)) break;
            pbVar16 = pbVar25 + 1;
          }
        }
        pToken->nType = 2;
        pbVar19 = pbVar25;
      }
      else if (bVar22 == 0x58) {
        do {
          pbVar19 = pbVar25;
          pStream->zText = pbVar19;
          if ((pbVar26 <= pbVar19) || (0xbf < (ulong)*pbVar19)) break;
          pbVar25 = pbVar19 + 1;
        } while ((*(byte *)((long)*ppuVar12 + (ulong)*pbVar19 * 2 + 1) & 0x10) != 0);
      }
    }
LAB_00121bf7:
    (pToken->sData).nByte = ((int)pbVar19 - uVar9) - iVar24;
    return 0;
  }
  pbVar16 = puVar2 + lVar18 + 1;
  pStream->zText = pbVar16;
  pToken->nType = 0x20;
  switch(bVar22) {
  case 0x21:
    if ((pbVar16 < pbVar26) && (*pbVar16 == 0x3d)) {
LAB_00121419:
      pbVar16 = puVar2 + lVar18 + 2;
      pStream->zText = pbVar16;
      if (pbVar16 < pbVar26) {
        if (*pbVar16 != 0x3d) goto LAB_00121796;
        lVar18 = lVar18 + 3;
LAB_00121792:
        pbVar16 = puVar2 + lVar18;
        pStream->zText = pbVar16;
        goto LAB_00121796;
      }
    }
    break;
  case 0x22:
    (pToken->sData).zString = (char *)pbVar16;
    while (pbVar16 < pbVar26) {
      bVar22 = *pbVar16;
      if (bVar22 == 0x7b) {
        pbVar19 = pbVar16 + 1;
        if ((pbVar19 < pbVar26) && (*pbVar19 == 0x24)) {
          iVar8 = 1;
          for (; pStream->zText = pbVar19, pbVar19 < pbVar26; pbVar19 = pbVar19 + 1) {
            bVar22 = *pbVar19;
            if (bVar22 == 10) {
              local_78 = local_78 + 1;
              pStream->nLine = local_78;
            }
            else if (bVar22 == 0x7d) {
              if (iVar8 < 2) {
                pbVar19 = pbVar19 + 1;
                pStream->zText = pbVar19;
                break;
              }
              iVar8 = iVar8 + -1;
            }
            else if (bVar22 == 0x7b) {
              iVar8 = iVar8 + 1;
            }
          }
          pbVar16 = pbVar19;
          if (pbVar19 < pbVar26) {
            bVar22 = *pbVar19;
            goto LAB_001216c9;
          }
          break;
        }
      }
      else {
LAB_001216c9:
        if (bVar22 == 10) {
          local_78 = local_78 + 1;
          pStream->nLine = local_78;
        }
        else if (bVar22 == 0x22) {
          if (pbVar16[-1] != 0x5c) break;
          bVar22 = 1;
          for (pbVar19 = pbVar16 + -2; (pStream->zInput < pbVar19 && (*pbVar19 == 0x5c));
              pbVar19 = pbVar19 + -1) {
            bVar22 = bVar22 + 1;
          }
          if (!(bool)(bVar22 & 1)) break;
        }
      }
      pbVar16 = pbVar16 + 1;
      pStream->zText = pbVar16;
    }
    (pToken->sData).nByte = (~uVar9 + (int)pbVar16) - iVar24;
    pToken->nType = 0x2000;
    pStream->zText = pbVar16 + 1;
    return 0;
  case 0x23:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    break;
  case 0x24:
    pToken->nType = 0x10;
    uVar20 = 0x10;
LAB_00121773:
    bVar7 = false;
    goto LAB_001217bf;
  case 0x25:
  case 0x2a:
  case 0x2f:
switchD_00121172_caseD_25:
    if (pbVar26 <= pbVar16) break;
    if (*pbVar16 == 0x3d) {
LAB_0012178a:
      lVar18 = lVar18 + 2;
      goto LAB_00121792;
    }
LAB_00121796:
    uVar20 = 0;
    goto LAB_00121799;
  case 0x26:
    pToken->nType = 0x200020;
    uVar20 = 0x200020;
    if ((pbVar16 < pbVar26) && ((*pbVar16 == 0x26 || (*pbVar16 == 0x3d)))) {
      pToken->nType = 0x20;
      pbVar16 = puVar2 + lVar18 + 2;
      pStream->zText = pbVar16;
      goto switchD_00121172_caseD_2e;
    }
    goto LAB_0012163f;
  case 0x27:
    (pToken->sData).zString = (char *)pbVar16;
    while (pbVar16 < pbVar26) {
      if (*pbVar16 == 10) {
        local_78 = local_78 + 1;
        pStream->nLine = local_78;
      }
      else if (*pbVar16 == 0x27) {
        if (pbVar16[-1] != 0x5c) break;
        bVar22 = 1;
        for (pbVar19 = pbVar16 + -2; (pStream->zInput < pbVar19 && (*pbVar19 == 0x5c));
            pbVar19 = pbVar19 + -1) {
          bVar22 = bVar22 + 1;
        }
        if (!(bool)(bVar22 & 1)) break;
      }
      pbVar16 = pbVar16 + 1;
      pStream->zText = pbVar16;
    }
    (pToken->sData).nByte = (int)pbVar16 + ~(uVar9 + iVar24);
    pToken->nType = 0x4000;
    pStream->zText = pbVar16 + 1;
    return 0;
  case 0x28:
    pToken->nType = 0x200;
    uVar20 = 0x200;
    bVar7 = false;
    goto LAB_001217bf;
  case 0x29:
    pSVar4 = pStream->pSet;
    uVar20 = pSVar4->nUsed;
    if (1 < uVar20) {
      pvVar3 = pSVar4->pBase;
      uVar14 = (ulong)((uVar20 - 1) * pSVar4->eSize);
      if ((((*(byte *)((long)pvVar3 + uVar14 + 0x10) & 4) != 0) &&
          (uVar1 = *(uint *)((long)pvVar3 + uVar14 + 0x18), (uVar1 & 0x78000) != 0)) &&
         ((*(byte *)((long)pvVar3 + (ulong)(pSVar4->eSize * (uVar20 - 2)) + 0x11) & 2) != 0)) {
        if ((uVar1 >> 0x11 & 1) == 0) {
          if ((short)uVar1 < 0) {
            zSrc = "(bool)";
          }
          else {
            zSrc = "(string)";
            if ((uVar1 >> 0x12 & 1) == 0) {
              zSrc = "(int)";
            }
          }
        }
        else {
          zSrc = "(float)";
        }
        (pToken->sData).zString = zSrc;
        sVar10 = SyStrlen(zSrc);
        (pToken->sData).nByte = sVar10;
        pjVar13 = jx9ExprExtractOperator(&pToken->sData,(SyToken *)0x0);
        pToken->pUserData = pjVar13;
        pSVar4->nUsed = uVar20 - 2;
        return 0;
      }
    }
    pToken->nType = 0x400;
    uVar20 = 0x400;
    bVar7 = false;
    goto LAB_001217bf;
  case 0x2b:
    if (pbVar16 < pbVar26) {
      if (*pbVar16 != 0x2b) {
        if (*pbVar16 != 0x3d) goto LAB_00121796;
        goto LAB_0012178a;
      }
LAB_001217b0:
      pbVar16 = puVar2 + lVar18 + 2;
      pStream->zText = pbVar16;
    }
    break;
  case 0x2c:
    pToken->nType = 0x20020;
    uVar20 = 0x20020;
    bVar7 = true;
    goto LAB_001217bf;
  case 0x2d:
    if (pbVar16 < pbVar26) {
      bVar22 = *pbVar16;
      if (bVar22 != 0x2d) {
LAB_001215eb:
        if (bVar22 != 0x3d) {
          if (bVar22 != 0x3e) goto LAB_00121796;
          goto LAB_0012178a;
        }
      }
      goto LAB_001217b0;
    }
    break;
  case 0x2e:
switchD_00121172_caseD_2e:
    uVar20 = 0;
LAB_0012163f:
    if ((pbVar16 < pbVar26) && ((*pbVar16 == 0x3d || (*pbVar16 == 0x2e)))) {
      pbVar16 = pbVar16 + 1;
      pStream->zText = pbVar16;
    }
LAB_00121799:
    bVar7 = true;
    goto LAB_001217bf;
  case 0x3a:
    pToken->nType = 0x100000;
    uVar20 = 0x100000;
    bVar7 = false;
    goto LAB_001217bf;
  case 0x3b:
    pToken->nType = 0x40000;
    uVar20 = 0x40000;
    bVar7 = false;
    goto LAB_001217bf;
  case 0x3c:
    if (pbVar16 < pbVar26) {
      bVar22 = *pbVar16;
      if (bVar22 != 0x3c) goto LAB_001215eb;
      pbVar16 = puVar2 + lVar18 + 2;
      pStream->zText = pbVar16;
      if (pbVar26 <= pbVar16) goto LAB_00121796;
      bVar22 = *pbVar16;
      if (bVar22 != 0x3c) goto joined_r0x0012153a;
      pbVar16 = puVar2 + lVar18 + 3;
      pStream->zText = pbVar16;
      for (pbVar19 = puVar2 + lVar18 + 4; local_50 = pbVar19 + -1, local_50 < pbVar26;
          pbVar19 = pbVar19 + 1) {
        bVar22 = *local_50;
        uVar14 = (ulong)bVar22;
        if (((0xbf < uVar14) || (bVar22 == 10)) || (((*ppuVar12)[uVar14] & 0x2000) == 0)) {
          if ((bVar22 == 0x22) || (bVar22 == 0x27)) {
            uVar14 = (ulong)*pbVar19;
            local_50 = pbVar19;
          }
          pbVar25 = local_50;
          pbVar19 = local_50;
          pbVar15 = local_50;
          if (((0xbf < (byte)uVar14) || ((byte)uVar14 == 0x5f)) || (((*ppuVar12)[uVar14] & 8) != 0))
          goto LAB_00121942;
          break;
        }
      }
      goto LAB_00121924;
    }
    break;
  case 0x3d:
    pToken->nType = 0x400020;
    uVar20 = 0x400020;
    bVar7 = true;
    if (pbVar26 <= pbVar16) goto LAB_00121799;
    if (*pbVar16 != 0x3d) goto LAB_001217bf;
    pToken->nType = 0x20;
    pbVar16 = puVar2 + lVar18 + 2;
    pStream->zText = pbVar16;
    if (pbVar16 < pbVar26) {
      bVar22 = *pbVar16;
joined_r0x0012153a:
      if (bVar22 == 0x3d) {
        pbVar16 = puVar2 + lVar18 + 3;
        pStream->zText = pbVar16;
      }
      goto LAB_00121796;
    }
    break;
  case 0x3e:
    if (pbVar16 < pbVar26) {
      if (*pbVar16 == 0x3d) goto LAB_001217b0;
      if (*pbVar16 == 0x3e) goto LAB_00121419;
    }
    break;
  default:
    if (bVar22 == 0x5b) {
      pToken->nType = 0x820;
      uVar20 = 0x820;
      bVar7 = true;
      goto LAB_001217bf;
    }
    if (bVar22 == 0x5d) {
      pToken->nType = 0x1000;
      uVar20 = 0x1000;
      bVar7 = false;
      goto LAB_001217bf;
    }
    if (bVar22 == 0x5e) goto switchD_00121172_caseD_25;
    if (bVar22 == 0x7b) {
      pToken->nType = 0x40;
      uVar20 = 0x40;
      goto LAB_00121773;
    }
    if (bVar22 == 0x7c) {
      if (pbVar16 < pbVar26) {
        if (*pbVar16 != 0x3d) {
          if (*pbVar16 == 0x7c) goto LAB_0012178a;
          goto LAB_00121796;
        }
        goto LAB_001217b0;
      }
    }
    else if (bVar22 == 0x7d) {
      pToken->nType = 0x80;
      uVar20 = 0x80;
      bVar7 = false;
      goto LAB_001217bf;
    }
  }
  uVar20 = 0;
  bVar7 = true;
LAB_001217bf:
  (pToken->sData).nByte = ((int)pbVar16 - uVar9) - iVar24;
  if (bVar7) {
    pSVar4 = pStream->pSet;
    if (pSVar4->nUsed == 0) {
      pLast = (SyToken *)0x0;
    }
    else {
      pLast = (SyToken *)((ulong)((pSVar4->nUsed - 1) * pSVar4->eSize) + (long)pSVar4->pBase);
    }
    pjVar13 = jx9ExprExtractOperator(&pToken->sData,pLast);
    if (pjVar13 == (jx9_expr_op *)0x0) {
      sVar10 = 0x1000000;
      if ((uVar20 & 0xffffffdf) != 0) {
        sVar10 = uVar20 & 0xffffffdf;
      }
      pToken->nType = sVar10;
    }
    else {
      pToken->pUserData = pjVar13;
    }
    return 0;
  }
  return 0;
LAB_00121942:
  do {
    pbVar23 = pbVar15;
    pbVar19 = pbVar19 + 1;
    if (pbVar25 < pbVar26) {
      uVar14 = (ulong)*pbVar25;
      if (uVar14 < 0xc0) {
        if ((uVar14 == 0x5f) || (((*ppuVar12)[uVar14] & 8) != 0)) {
          pbVar25 = pbVar25 + 1;
          pbVar15 = pbVar23;
          goto LAB_00121942;
        }
      }
      else {
        pbVar25 = pbVar26;
        if (pbVar19 < pbVar26) {
          pbVar25 = pbVar19;
        }
      }
    }
    pbVar19 = pbVar25;
    pbVar15 = pbVar25;
  } while (pbVar25 != pbVar23);
  uVar14 = (long)pbVar23 - (long)local_50;
  if ((*pbVar23 == 0x22) || (*pbVar23 == 0x27)) {
    pbVar23 = pbVar23 + 1;
  }
  iVar8 = (int)pbVar23;
  for (; iVar8 = iVar8 + 1, pbVar23 < pbVar26; pbVar23 = pbVar23 + 1) {
    uVar17 = (ulong)*pbVar23;
    if (0xbf < uVar17) break;
    puVar5 = *ppuVar12;
    if ((uVar17 == 10) || ((puVar5[uVar17] & 0x2000) == 0)) {
      local_58 = (uint)uVar14;
      if (local_58 != 0) {
        uVar20 = 0;
        bVar7 = true;
        if (*pbVar23 == 10) {
          local_78 = local_78 + 1;
          pStream->nLine = local_78;
          uVar14 = uVar14 & 0xffffffff;
          pbVar16 = pbVar23 + 1;
LAB_00121a55:
          do {
            do {
              pbVar25 = pbVar16;
              pbVar19 = pbVar25 + uVar14 + 2;
              lVar18 = 0;
              while( true ) {
                pbVar16 = pbVar25 + lVar18;
                if (pbVar26 <= pbVar16) {
                  pStream->zText = pbVar26;
                  goto LAB_00121b67;
                }
                if (*pbVar16 == 10) break;
                lVar18 = lVar18 + 1;
                pbVar19 = pbVar19 + 1;
              }
              local_78 = local_78 + 1;
              pStream->nLine = local_78;
              pbVar16 = pbVar25 + lVar18 + 1;
            } while (((uint)((((int)pbVar26 + -1) - (int)pbVar25) - (int)lVar18) < local_58) ||
                    (sVar11 = SyMemcmp(local_50,pbVar16,local_58), sVar11 != 0));
            pbVar15 = pbVar25 + lVar18 + uVar14;
            while( true ) {
              pbVar15 = pbVar15 + 1;
              if (pbVar26 <= pbVar15) goto LAB_00121b4c;
              bVar22 = *pbVar15;
              uVar17 = (ulong)bVar22;
              if (((0xbf < uVar17) || (uVar17 == 10)) || ((puVar5[uVar17] & 0x2000) == 0)) break;
              pbVar19 = pbVar19 + 1;
            }
            pbVar16 = pbVar15;
            if (uVar17 == 0x3b) {
              do {
                pbVar16 = pbVar19;
                if (pbVar26 <= pbVar16) goto LAB_00121b4c;
                bVar22 = *pbVar16;
                uVar17 = (ulong)bVar22;
                if (0xbf < uVar17) goto LAB_00121a55;
              } while ((uVar17 != 10) && (pbVar19 = pbVar16 + 1, (puVar5[uVar17] & 0x2000) != 0));
            }
          } while (bVar22 != 10);
LAB_00121b4c:
          pStream->zText = pbVar15;
          pbVar16 = pbVar25 + lVar18 + 1;
LAB_00121b67:
          pToken->nType = 0x10000;
          (pToken->sData).zString = (char *)(pbVar23 + 1);
          uVar14 = (ulong)(uint)((int)pbVar16 - iVar8);
          while( true ) {
            (pToken->sData).nByte = (uint)uVar14;
            if (uVar14 == 0) {
              return 0;
            }
            pbVar26 = pbVar23 + uVar14;
            if (0xffffffffffffffbf < (ulong)(long)(char)*pbVar26) break;
            uVar14 = uVar14 - 1;
            if ((*(byte *)((long)*ppuVar12 + (long)(char)*pbVar26 * 2 + 1) & 0x20) == 0) {
              return 0;
            }
          }
          return 0;
        }
        goto LAB_001217bf;
      }
      break;
    }
  }
LAB_00121924:
  uVar20 = 0;
  bVar7 = true;
  goto LAB_001217bf;
}

Assistant:

static sxi32 jx9TokenizeInput(SyStream *pStream,SyToken *pToken,void *pUserData,void *pCtxData)
{
	SyString *pStr;
	sxi32 rc;
	/* Ignore leading white spaces */
	while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisSpace(pStream->zText[0]) ){
		/* Advance the stream cursor */
		if( pStream->zText[0] == '\n' ){
			/* Update line counter */
			pStream->nLine++;
		}
		pStream->zText++;
	}
	if( pStream->zText >= pStream->zEnd ){
		/* End of input reached */
		return SXERR_EOF;
	}
	/* Record token starting position and line */
	pToken->nLine = pStream->nLine;
	pToken->pUserData = 0;
	pStr = &pToken->sData;
	SyStringInitFromBuf(pStr, pStream->zText, 0);
	if( pStream->zText[0] >= 0xc0 || SyisAlpha(pStream->zText[0]) || pStream->zText[0] == '_' ){
		/* The following code fragment is taken verbatim from the xPP source tree.
		 * xPP is a modern embeddable macro processor with advanced features useful for
		 * application seeking for a production quality, ready to use macro processor.
		 * xPP is a widely used library developed and maintened by Symisc Systems.
		 * You can reach the xPP home page by following this link:
		 * http://xpp.symisc.net/
		 */
		const unsigned char *zIn;
		sxu32 nKeyword;
		/* Isolate UTF-8 or alphanumeric stream */
		if( pStream->zText[0] < 0xc0 ){
			pStream->zText++;
		}
		for(;;){
			zIn = pStream->zText;
			if( zIn[0] >= 0xc0 ){
				zIn++;
				/* UTF-8 stream */
				while( zIn < pStream->zEnd && ((zIn[0] & 0xc0) == 0x80) ){
					zIn++;
				}
			}
			/* Skip alphanumeric stream */
			while( zIn < pStream->zEnd && zIn[0] < 0xc0 && (SyisAlphaNum(zIn[0]) || zIn[0] == '_') ){
				zIn++;
			}
			if( zIn == pStream->zText ){
				/* Not an UTF-8 or alphanumeric stream */
				break;
			}
			/* Synchronize pointers */
			pStream->zText = zIn;
		}
		/* Record token length */
		pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
		nKeyword = keywordCode(pStr->zString, (int)pStr->nByte);
		if( nKeyword != JX9_TK_ID ){
			/* We are dealing with a keyword [i.e: if, function, CREATE, ...], save the keyword ID */
			pToken->nType = JX9_TK_KEYWORD;
			pToken->pUserData = SX_INT_TO_PTR(nKeyword);
		}else{
			/* A simple identifier */
			pToken->nType = JX9_TK_ID;
		}
	}else{
		sxi32 c;
		/* Non-alpha stream */
		if( pStream->zText[0] == '#' || 
			( pStream->zText[0] == '/' &&  &pStream->zText[1] < pStream->zEnd && pStream->zText[1] == '/') ){
				pStream->zText++;
				/* Inline comments */
				while( pStream->zText < pStream->zEnd && pStream->zText[0] != '\n' ){
					pStream->zText++;
				}
				/* Tell the upper-layer to ignore this token */ 
				return SXERR_CONTINUE;
		}else if( pStream->zText[0] == '/' && &pStream->zText[1] < pStream->zEnd && pStream->zText[1] == '*' ){
			pStream->zText += 2;
			/* Block comment */
			while( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '*' ){
					if( &pStream->zText[1] >= pStream->zEnd || pStream->zText[1] == '/'  ){
						break;
					}
				}
				if( pStream->zText[0] == '\n' ){
					pStream->nLine++;
				}
				pStream->zText++;
			}
			pStream->zText += 2;
			/* Tell the upper-layer to ignore this token */
			return SXERR_CONTINUE;
		}else if( SyisDigit(pStream->zText[0]) ){
			pStream->zText++;
			/* Decimal digit stream */
			while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
				pStream->zText++;
			}
			/* Mark the token as integer until we encounter a real number */
			pToken->nType = JX9_TK_INTEGER;
			if( pStream->zText < pStream->zEnd ){
				c = pStream->zText[0];
				if( c == '.' ){
					/* Real number */
					pStream->zText++;
					while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
						pStream->zText++;
					}
					if( pStream->zText < pStream->zEnd ){
						c = pStream->zText[0];
						if( c=='e' || c=='E' ){
							pStream->zText++;
							if( pStream->zText < pStream->zEnd ){
								c = pStream->zText[0];
								if( (c =='+' || c=='-') && &pStream->zText[1] < pStream->zEnd  &&
									pStream->zText[1] < 0xc0 && SyisDigit(pStream->zText[1]) ){
										pStream->zText++;
								}
								while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
									pStream->zText++;
								}
							}
						}
					}
					pToken->nType = JX9_TK_REAL;
				}else if( c=='e' || c=='E' ){
					SXUNUSED(pUserData); /* Prevent compiler warning */
					SXUNUSED(pCtxData);
					pStream->zText++;
					if( pStream->zText < pStream->zEnd ){
						c = pStream->zText[0];
						if( (c =='+' || c=='-') && &pStream->zText[1] < pStream->zEnd  &&
							pStream->zText[1] < 0xc0 && SyisDigit(pStream->zText[1]) ){
								pStream->zText++;
						}
						while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
							pStream->zText++;
						}
					}
					pToken->nType = JX9_TK_REAL;
				}else if( c == 'x' || c == 'X' ){
					/* Hex digit stream */
					pStream->zText++;
					while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisHex(pStream->zText[0]) ){
						pStream->zText++;
					}
				}else if(c  == 'b' || c == 'B' ){
					/* Binary digit stream */
					pStream->zText++;
					while( pStream->zText < pStream->zEnd && (pStream->zText[0] == '0' || pStream->zText[0] == '1') ){
						pStream->zText++;
					}
				}
			}
			/* Record token length */
			pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
			return SXRET_OK;
		}
		c = pStream->zText[0];
		pStream->zText++; /* Advance the stream cursor */
		/* Assume we are dealing with an operator*/
		pToken->nType = JX9_TK_OP;
		switch(c){
		case '$': pToken->nType = JX9_TK_DOLLAR; break;
		case '{': pToken->nType = JX9_TK_OCB;   break; 
		case '}': pToken->nType = JX9_TK_CCB;    break;
		case '(': pToken->nType = JX9_TK_LPAREN; break; 
		case '[': pToken->nType |= JX9_TK_OSB;   break; /* Bitwise operation here, since the square bracket token '[' 
														 * is a potential operator [i.e: subscripting] */
		case ']': pToken->nType = JX9_TK_CSB;    break;
		case ')': {
			SySet *pTokSet = pStream->pSet;
			/* Assemble type cast operators [i.e: (int), (float), (bool)...] */ 
			if( pTokSet->nUsed >= 2 ){
				SyToken *pTmp;
				/* Peek the last recongnized token */
				pTmp = (SyToken *)SySetPeek(pTokSet);
				if( pTmp->nType & JX9_TK_KEYWORD ){
					sxi32 nID = SX_PTR_TO_INT(pTmp->pUserData);
					if( (sxu32)nID & (JX9_TKWRD_INT|JX9_TKWRD_FLOAT|JX9_TKWRD_STRING|JX9_TKWRD_BOOL) ){
						pTmp = (SyToken *)SySetAt(pTokSet, pTokSet->nUsed - 2);
						if( pTmp->nType & JX9_TK_LPAREN ){
							/* Merge the three tokens '(' 'TYPE' ')' into a single one */
							const char * zTypeCast = "(int)";
							if( nID & JX9_TKWRD_FLOAT ){
								zTypeCast = "(float)";
							}else if( nID & JX9_TKWRD_BOOL ){
								zTypeCast = "(bool)";
							}else if( nID & JX9_TKWRD_STRING ){
								zTypeCast = "(string)";
							}
							/* Reflect the change */
							pToken->nType = JX9_TK_OP;
							SyStringInitFromBuf(&pToken->sData, zTypeCast, SyStrlen(zTypeCast));
							/* Save the instance associated with the type cast operator */
							pToken->pUserData = (void *)jx9ExprExtractOperator(&pToken->sData, 0);
							/* Remove the two previous tokens */
							pTokSet->nUsed -= 2;
							return SXRET_OK;
						}
					}
				}
			}
			pToken->nType = JX9_TK_RPAREN;
			break;
				  }
		case '\'':{
			/* Single quoted string */
			pStr->zString++;
			while( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '\''  ){
					if( pStream->zText[-1] != '\\' ){
						break;
					}else{
						const unsigned char *zPtr = &pStream->zText[-2];
						sxi32 i = 1;
						while( zPtr > pStream->zInput && zPtr[0] == '\\' ){
							zPtr--;
							i++;
						}
						if((i&1)==0){
							break;
						}
					}
				}
				if( pStream->zText[0] == '\n' ){
					pStream->nLine++;
				}
				pStream->zText++;
			}
			/* Record token length and type */
			pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
			pToken->nType = JX9_TK_SSTR;
			/* Jump the trailing single quote */
			pStream->zText++;
			return SXRET_OK;
				  }
		case '"':{
			sxi32 iNest;
			/* Double quoted string */
			pStr->zString++;
			while( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '{' && &pStream->zText[1] < pStream->zEnd && pStream->zText[1] == '$'){
					iNest = 1;
					pStream->zText++;
					/* TICKET 1433-40: Hnadle braces'{}' in double quoted string where everything is allowed */
					while(pStream->zText < pStream->zEnd ){
						if( pStream->zText[0] == '{' ){
							iNest++;
						}else if (pStream->zText[0] == '}' ){
							iNest--;
							if( iNest <= 0 ){
								pStream->zText++;
								break;
							}
						}else if( pStream->zText[0] == '\n' ){
							pStream->nLine++;
						}
						pStream->zText++;
					}
					if( pStream->zText >= pStream->zEnd ){
						break;
					}
				}
				if( pStream->zText[0] == '"' ){
					if( pStream->zText[-1] != '\\' ){
						break;
					}else{
						const unsigned char *zPtr = &pStream->zText[-2];
						sxi32 i = 1;
						while( zPtr > pStream->zInput && zPtr[0] == '\\' ){
							zPtr--;
							i++;
						}
						if((i&1)==0){
							break;
						}
					}
				}
				if( pStream->zText[0] == '\n' ){
					pStream->nLine++;
				}
				pStream->zText++;
			}
			/* Record token length and type */
			pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
			pToken->nType = JX9_TK_DSTR;
			/* Jump the trailing quote */
			pStream->zText++;
			return SXRET_OK;
				  }
		case ':':
			pToken->nType = JX9_TK_COLON; /* Single colon */
			break;
		case ',': pToken->nType |= JX9_TK_COMMA;  break; /* Comma is also an operator */
		case ';': pToken->nType = JX9_TK_SEMI;   break;
			/* Handle combined operators [i.e: +=, ===, !=== ...] */
		case '=':
			pToken->nType |= JX9_TK_EQUAL;
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '=' ){
					pToken->nType &= ~JX9_TK_EQUAL;
					/* Current operator: == */
					pStream->zText++;
					if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
						/* Current operator: === */
						pStream->zText++;
					}
				}
			}
			break;
		case '!':
			if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
				/* Current operator: != */
				pStream->zText++;
				if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
					/* Current operator: !== */
					pStream->zText++;
				}
			}
			break;
		case '&':
			pToken->nType |= JX9_TK_AMPER;
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '&' ){
					pToken->nType &= ~JX9_TK_AMPER;
					/* Current operator: && */
					pStream->zText++;
				}else if( pStream->zText[0] == '=' ){
					pToken->nType &= ~JX9_TK_AMPER;
					/* Current operator: &= */
					pStream->zText++;
				}
			}
		case '.':
			if( pStream->zText < pStream->zEnd && (pStream->zText[0] == '.' || pStream->zText[0] == '=') ){
				/* Concatenation operator: '..' or '.='  */
				pStream->zText++;
			}
			break;
		case '|':
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '|' ){
					/* Current operator: || */
					pStream->zText++;
				}else if( pStream->zText[0] == '=' ){
					/* Current operator: |= */
					pStream->zText++;
				}
			}
			break;
		case '+':
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '+' ){
					/* Current operator: ++ */
					pStream->zText++;
				}else if( pStream->zText[0] == '=' ){
					/* Current operator: += */
					pStream->zText++;
				}
			}
			break;
		case '-':
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '-' ){
					/* Current operator: -- */
					pStream->zText++;
				}else if( pStream->zText[0] == '=' ){
					/* Current operator: -= */
					pStream->zText++;
				}else if( pStream->zText[0] == '>' ){
					/* Current operator: -> */
					pStream->zText++;
				}
			}
			break;
		case '*':
			if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
				/* Current operator: *= */
				pStream->zText++;
			}
			break;
		case '/':
			if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
				/* Current operator: /= */
				pStream->zText++;
			}
			break;
		case '%':
			if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
				/* Current operator: %= */
				pStream->zText++;
			}
			break;
		case '^':
			if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
				/* Current operator: ^= */
				pStream->zText++;
			}
			break;
		case '<':
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '<' ){
					/* Current operator: << */
					pStream->zText++;
					if( pStream->zText < pStream->zEnd ){
						if( pStream->zText[0] == '=' ){
							/* Current operator: <<= */
							pStream->zText++;
						}else if( pStream->zText[0] == '<' ){
							/* Current Token: <<<  */
							pStream->zText++;
							/* This may be the beginning of a Heredoc/Nowdoc string, try to delimit it */
							rc = LexExtractNowdoc(&(*pStream), &(*pToken));
							if( rc == SXRET_OK ){
								/* Here/Now doc successfuly extracted */
								return SXRET_OK;
							}
						}
					}
				}else if( pStream->zText[0] == '>' ){
					/* Current operator: <> */
					pStream->zText++;
				}else if( pStream->zText[0] == '=' ){
					/* Current operator: <= */
					pStream->zText++;
				}
			}
			break;
		case '>':
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '>' ){
					/* Current operator: >> */
					pStream->zText++;
					if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
						/* Current operator: >>= */
						pStream->zText++;
					}
				}else if( pStream->zText[0] == '=' ){
					/* Current operator: >= */
					pStream->zText++;
				}
			}
			break;
		default:
			break;
		}
		if( pStr->nByte <= 0 ){
			/* Record token length */
			pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
		}
		if( pToken->nType & JX9_TK_OP ){
			const jx9_expr_op *pOp;
			/* Check if the extracted token is an operator */
			pOp = jx9ExprExtractOperator(pStr, (SyToken *)SySetPeek(pStream->pSet));
			if( pOp == 0 ){
				/* Not an operator */
				pToken->nType &= ~JX9_TK_OP;
				if( pToken->nType <= 0 ){
					pToken->nType = JX9_TK_OTHER;
				}
			}else{
				/* Save the instance associated with this operator for later processing */
				pToken->pUserData = (void *)pOp;
			}
		}
	}
	/* Tell the upper-layer to save the extracted token for later processing */
	return SXRET_OK;
}